

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void __thiscall wallet::wallet_tests::ComputeTimeSmart::test_method(ComputeTimeSmart *this)

{
  bool bVar1;
  type wallet;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffffc18;
  lazy_ostream *in_stack_fffffffffffffc20;
  basic_cstring<const_char> *in_stack_fffffffffffffc28;
  type in_stack_fffffffffffffc40;
  size_t in_stack_fffffffffffffc48;
  ChainstateManager *line_num;
  const_string *in_stack_fffffffffffffc50;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffc58;
  unit_test_log_t *this_00;
  int64_t in_stack_fffffffffffffc98;
  char *blockTime;
  int64_t in_stack_fffffffffffffca0;
  int64_t mockTime;
  int64_t in_stack_fffffffffffffca8;
  uint32_t lockTime;
  CWallet *in_stack_fffffffffffffcb0;
  ChainstateManager *in_stack_fffffffffffffcb8;
  ChainstateManager *chainman;
  lazy_ostream local_244;
  undefined1 local_228 [32];
  unit_test_log_t local_208 [2];
  const_string local_1f8;
  lazy_ostream local_1e4;
  undefined1 local_1c8 [68];
  lazy_ostream local_184;
  undefined1 local_168 [68];
  lazy_ostream local_124;
  undefined1 local_108 [68];
  lazy_ostream local_c4;
  undefined1 local_a8 [68];
  lazy_ostream local_64;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc28,(pointer)in_stack_fffffffffffffc20,
               (unsigned_long)in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
               (const_string *)in_stack_fffffffffffffc40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc20,(char (*) [1])in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc28,(pointer)in_stack_fffffffffffffc20,
               (unsigned_long)in_stack_fffffffffffffc18);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_fffffffffffffc28);
    local_64._4_8_ =
         AddTx(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
               (uint32_t)((ulong)in_stack_fffffffffffffca8 >> 0x20),in_stack_fffffffffffffca0,
               in_stack_fffffffffffffc98);
    local_64._vptr_lazy_ostream._0_4_ = 100;
    in_stack_fffffffffffffc28 = (basic_cstring<const_char> *)0x1e7c53f;
    in_stack_fffffffffffffc20 = &local_64;
    in_stack_fffffffffffffc18 = "AddTx(*m_node.chainman, m_wallet, 1, 100, 120)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_48,&local_64.field_0xc,0x1aa,1,2,
               (undefined1 *)((long)&local_64._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc28,(pointer)in_stack_fffffffffffffc20,
               (unsigned_long)in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
               (const_string *)in_stack_fffffffffffffc40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc20,(char (*) [1])in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc28,(pointer)in_stack_fffffffffffffc20,
               (unsigned_long)in_stack_fffffffffffffc18);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_fffffffffffffc28);
    local_c4._4_8_ =
         AddTx(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
               (uint32_t)((ulong)in_stack_fffffffffffffca8 >> 0x20),in_stack_fffffffffffffca0,
               in_stack_fffffffffffffc98);
    local_c4._vptr_lazy_ostream._0_4_ = 100;
    in_stack_fffffffffffffc28 = (basic_cstring<const_char> *)0x1e7c53f;
    in_stack_fffffffffffffc20 = &local_c4;
    in_stack_fffffffffffffc18 = "AddTx(*m_node.chainman, m_wallet, 1, 200, 220)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_a8,&local_c4.field_0xc,0x1ad,1,2,
               (undefined1 *)((long)&local_c4._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc28,(pointer)in_stack_fffffffffffffc20,
               (unsigned_long)in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
               (const_string *)in_stack_fffffffffffffc40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc20,(char (*) [1])in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc28,(pointer)in_stack_fffffffffffffc20,
               (unsigned_long)in_stack_fffffffffffffc18);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_fffffffffffffc28);
    local_124._4_8_ =
         AddTx(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
               (uint32_t)((ulong)in_stack_fffffffffffffca8 >> 0x20),in_stack_fffffffffffffca0,
               in_stack_fffffffffffffc98);
    local_124._vptr_lazy_ostream._0_4_ = 300;
    in_stack_fffffffffffffc28 = (basic_cstring<const_char> *)0x1c13f98;
    in_stack_fffffffffffffc20 = &local_124;
    in_stack_fffffffffffffc18 = "AddTx(*m_node.chainman, m_wallet, 2, 300, 0)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_108,&local_124.field_0xc,0x1b0,1,2,
               (undefined1 *)((long)&local_124._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    lockTime = (uint32_t)((ulong)in_stack_fffffffffffffca8 >> 0x20);
    chainman = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc28,(pointer)in_stack_fffffffffffffc20,
               (unsigned_long)in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
               (const_string *)in_stack_fffffffffffffc40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc20,(char (*) [1])in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc28,(pointer)in_stack_fffffffffffffc20,
               (unsigned_long)in_stack_fffffffffffffc18);
    wallet = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
                       ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                        in_stack_fffffffffffffc28);
    in_stack_fffffffffffffca8 =
         AddTx(chainman,(CWallet *)wallet,lockTime,in_stack_fffffffffffffca0,
               in_stack_fffffffffffffc98);
    local_184._vptr_lazy_ostream._0_4_ = 400;
    in_stack_fffffffffffffc28 = (basic_cstring<const_char> *)0x1d2ae72;
    in_stack_fffffffffffffc20 = &local_184;
    in_stack_fffffffffffffc18 = "AddTx(*m_node.chainman, m_wallet, 3, 420, 400)";
    local_184._4_8_ = in_stack_fffffffffffffca8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_168,&local_184.field_0xc,0x1b3,1,2,
               (undefined1 *)((long)&local_184._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    blockTime = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
    ;
    mockTime = 0x6c;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc28,(pointer)in_stack_fffffffffffffc20,
               (unsigned_long)in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
               (const_string *)in_stack_fffffffffffffc40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc20,(char (*) [1])in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc28,(pointer)in_stack_fffffffffffffc20,
               (unsigned_long)in_stack_fffffffffffffc18);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_fffffffffffffc28);
    local_1e4._4_8_ =
         AddTx(chainman,(CWallet *)wallet,(uint32_t)((ulong)in_stack_fffffffffffffca8 >> 0x20),
               mockTime,(int64_t)blockTime);
    local_1e4._vptr_lazy_ostream._0_4_ = 400;
    in_stack_fffffffffffffc28 = (basic_cstring<const_char> *)0x1d2ae72;
    in_stack_fffffffffffffc20 = &local_1e4;
    in_stack_fffffffffffffc18 = "AddTx(*m_node.chainman, m_wallet, 4, 500, 390)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_1c8,&local_1e4.field_0xc,0x1b7,1,2,
               (undefined1 *)((long)&local_1e4._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = &local_1f8;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc28,(pointer)in_stack_fffffffffffffc20,
               (unsigned_long)in_stack_fffffffffffffc18);
    this_00 = local_208;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)line_num,(const_string *)in_stack_fffffffffffffc40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc20,(char (*) [1])in_stack_fffffffffffffc18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc28,(pointer)in_stack_fffffffffffffc20,
               (unsigned_long)in_stack_fffffffffffffc18);
    in_stack_fffffffffffffc40 =
         std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
                   ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                    in_stack_fffffffffffffc28);
    local_244._4_8_ =
         AddTx(chainman,(CWallet *)wallet,(uint32_t)((ulong)in_stack_fffffffffffffca8 >> 0x20),
               mockTime,(int64_t)blockTime);
    local_244._vptr_lazy_ostream._0_4_ = 300;
    in_stack_fffffffffffffc28 = (basic_cstring<const_char> *)0x1c13f98;
    in_stack_fffffffffffffc20 = &local_244;
    in_stack_fffffffffffffc18 = "AddTx(*m_node.chainman, m_wallet, 5, 50, 600)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_228,&local_244.field_0xc,0x1bb,1,2,
               (undefined1 *)((long)&local_244._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc18);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(ComputeTimeSmart)
{
    // New transaction should use clock time if lower than block time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 1, 100, 120), 100);

    // Test that updating existing transaction does not change smart time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 1, 200, 220), 100);

    // New transaction should use clock time if there's no block time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 2, 300, 0), 300);

    // New transaction should use block time if lower than clock time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 3, 420, 400), 400);

    // New transaction should use latest entry time if higher than
    // min(block time, clock time).
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 4, 500, 390), 400);

    // If there are future entries, new transaction should use time of the
    // newest entry that is no more than 300 seconds ahead of the clock time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 5, 50, 600), 300);
}